

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

uint prvTidytmbstrncpy(tmbstr s1,ctmbstr s2,uint size)

{
  long lVar1;
  
  if (s2 != (ctmbstr)0x0 && s1 != (tmbstr)0x0) {
    for (lVar1 = 0; s2[lVar1] != '\0'; lVar1 = lVar1 + 1) {
      if (size == 1) {
        size = 0;
        break;
      }
      s1[lVar1] = s2[lVar1];
      size = size - 1;
    }
    s1[lVar1] = '\0';
  }
  return size;
}

Assistant:

uint TY_(tmbstrncpy)( tmbstr s1, ctmbstr s2, uint size )
{
    if ( s1 != NULL && s2 != NULL )
    {
        tmbstr cp = s1;
        while ( *s2 && --size )  /* Predecrement: reserve byte */
            *cp++ = *s2++;       /* for NULL terminator. */
        *cp = 0;
    }
    return size;
}